

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::write_metadata_packet
          (ut_metadata_peer_plugin *this,msg_t type,int piece)

{
  bt_peer_connection *pbVar1;
  bool bVar2;
  entry *peVar3;
  index_type iVar4;
  int *piVar5;
  counters *pcVar6;
  span<char> local_1e0;
  span<const_char> local_1d0;
  int local_1c0;
  int local_1bc;
  int total_size;
  int len;
  char *p;
  char *header;
  char msg [200];
  span<const_char> local_d8;
  int local_c4;
  span<const_char> local_c0;
  int local_ac;
  undefined1 auStack_a8 [4];
  int offset;
  span<const_char> local_98;
  int local_84;
  char *pcStack_80;
  int metadata_piece_size;
  char *metadata;
  string_view local_58;
  undefined1 local_48 [8];
  entry e;
  char *n;
  int piece_local;
  msg_t type_local;
  ut_metadata_peer_plugin *this_local;
  
  e.super_variant_type.
  super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  .
  super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
  ._32_8_ = (long)
            "BT-SEARCH * HTTP/1.1\r\nHost: %s:6771\r\nPort: %d\r\nInfohash: %s\r\ncookie: %x\r\n\r\n\r\n"
            + 0x4d;
  if (type < (dont_have|piece)) {
    e.super_variant_type.
    super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    ._32_8_ = write_metadata_packet::names[(int)(uint)type];
  }
  libtorrent::aux::peer_connection::peer_log
            (&this->m_pc->super_peer_connection,outgoing_message,"UT_METADATA",
             "type: %d (%s) piece: %d",(ulong)type,
             e.super_variant_type.
             super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
             .
             super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
             .
             super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
             .
             super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
             .
             super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
             .
             super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
             ._32_8_,piece);
  if (this->m_message_index != 0) {
    entry::entry((entry *)local_48);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"msg_type")
    ;
    peVar3 = entry::operator[]((entry *)local_48,local_58);
    entry::operator=(peVar3,(ulong)type);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&metadata,"piece");
    peVar3 = entry::operator[]((entry *)local_48,_metadata);
    entry::operator=(peVar3,(long)piece);
    pcStack_80 = (char *)0x0;
    local_84 = 0;
    bVar2 = libtorrent::aux::torrent::valid_metadata(this->m_torrent);
    if (bVar2) {
      local_98 = ut_metadata_plugin::metadata(this->m_tp);
      iVar4 = span<const_char>::size(&local_98);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_a8,"total_size");
      peVar3 = entry::operator[]((entry *)local_48,_auStack_a8);
      entry::operator=(peVar3,iVar4);
    }
    if (type == piece) {
      local_ac = piece << 0xe;
      local_c0 = ut_metadata_plugin::metadata(this->m_tp);
      pcStack_80 = span<const_char>::data(&local_c0);
      pcStack_80 = pcStack_80 + local_ac;
      local_d8 = ut_metadata_plugin::metadata(this->m_tp);
      iVar4 = span<const_char>::size(&local_d8);
      local_c4 = (int)iVar4 - local_ac;
      msg[0xc4] = '\0';
      msg[0xc5] = '@';
      msg[0xc6] = '\0';
      msg[199] = '\0';
      piVar5 = ::std::min<int>(&local_c4,(int *)(msg + 0xc4));
      local_84 = *piVar5;
    }
    p = (char *)&header;
    _total_size = (char *)((long)&header + 6);
    local_1bc = bencode<char*>(_total_size,(entry *)local_48);
    local_1c0 = local_1bc + 2 + local_84;
    libtorrent::aux::write_uint32<int,char*>(local_1c0,&p);
    libtorrent::aux::write_uint8<libtorrent::aux::bt_peer_connection::message_type,char*>
              (msg_extended,&p);
    libtorrent::aux::write_uint8<int,char*>(this->m_message_index,&p);
    pbVar1 = this->m_pc;
    span<const_char>::span(&local_1d0,(char *)&header,(long)(local_1bc + 6));
    libtorrent::aux::peer_connection::send_buffer(&pbVar1->super_peer_connection,local_1d0);
    if (local_84 != 0) {
      pbVar1 = this->m_pc;
      span<char>::span(&local_1e0,pcStack_80,(long)local_84);
      libtorrent::aux::bt_peer_connection::append_const_send_buffer<libtorrent::span<char>>
                (pbVar1,local_1e0,local_84);
    }
    pcVar6 = libtorrent::aux::peer_connection::stats_counters(&this->m_pc->super_peer_connection);
    counters::inc_stats_counter(pcVar6,0x67,1);
    pcVar6 = libtorrent::aux::peer_connection::stats_counters(&this->m_pc->super_peer_connection);
    counters::inc_stats_counter(pcVar6,0x66,1);
    entry::~entry((entry *)local_48);
  }
  return;
}

Assistant:

void write_metadata_packet(msg_t const type, int const piece)
		{
			TORRENT_ASSERT(!m_pc.associated_torrent().expired());

#ifndef TORRENT_DISABLE_LOGGING
			static char const* names[] = {"request", "data", "dont-have"};
			char const* n = "";
			if (type >= msg_t::request && type <= msg_t::dont_have) n = names[static_cast<int>(type)];
			m_pc.peer_log(peer_log_alert::outgoing_message, "UT_METADATA"
				, "type: %d (%s) piece: %d", static_cast<int>(type), n, piece);
#endif

			// abort if the peer doesn't support the metadata extension
			if (m_message_index == 0) return;

			entry e;
			e["msg_type"] = static_cast<int>(type);
			e["piece"] = piece;

			char const* metadata = nullptr;
			int metadata_piece_size = 0;

			if (m_torrent.valid_metadata())
				e["total_size"] = m_tp.metadata().size();

			if (type == msg_t::piece)
			{
				TORRENT_ASSERT(piece >= 0 && piece < (m_tp.metadata().size() + 16 * 1024 - 1) / (16 * 1024));
				TORRENT_ASSERT(m_pc.associated_torrent().lock()->valid_metadata());
				TORRENT_ASSERT(m_torrent.valid_metadata());

				int const offset = piece * 16 * 1024;
				metadata = m_tp.metadata().data() + offset;
				metadata_piece_size = std::min(
					int(m_tp.metadata().size()) - offset, 16 * 1024);
				TORRENT_ASSERT(metadata_piece_size > 0);
				TORRENT_ASSERT(offset >= 0);
				TORRENT_ASSERT(offset + metadata_piece_size <= m_tp.metadata().size());
			}

			// TODO: 3 use the aux::write_* functions and the span here instead, it
			// will fit better with send_buffer()
			char msg[200];
			char* header = msg;
			char* p = &msg[6];
			int const len = bencode(p, e);
			int const total_size = 2 + len + metadata_piece_size;
			namespace io = aux;
			io::write_uint32(total_size, header);
			io::write_uint8(aux::bt_peer_connection::msg_extended, header);
			io::write_uint8(m_message_index, header);

			m_pc.send_buffer({msg, len + 6});
			// TODO: we really need to increment the refcounter on the torrent
			// while this buffer is still in the peer's send buffer
			if (metadata_piece_size)
			{
				m_pc.append_const_send_buffer(
					span<char>(const_cast<char*>(metadata), metadata_piece_size), metadata_piece_size);
			}

			m_pc.stats_counters().inc_stats_counter(counters::num_outgoing_extended);
			m_pc.stats_counters().inc_stats_counter(counters::num_outgoing_metadata);
		}